

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O0

int __thiscall gdsForge::GDSwriteRec(gdsForge *this,int record)

{
  ostream *this_00;
  bool bVar1;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  char local_1d;
  int local_1c;
  uchar OHout [4];
  int record_local;
  gdsForge *this_local;
  
  local_20 = 0;
  local_1f = 4;
  local_1e = (undefined1)((uint)record >> 8);
  local_1d = (char)record;
  bVar1 = local_1d == '\0';
  local_1c = record;
  _OHout = this;
  if (bVar1) {
    fwrite(&local_20,1,4,(FILE *)this->gdsFile);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "The smoke has escaped. The record must be dataless");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  this_local._4_4_ = (uint)!bVar1;
  return this_local._4_4_;
}

Assistant:

int gdsForge::GDSwriteRec(int record)
{
  unsigned char OHout[4];

  OHout[0] = 0;
  OHout[1] = 4;
  OHout[2] = record >> 8 & 0xff;
  OHout[3] = record & 0xff;

  if (OHout[3] != 0) {
    cout << "The smoke has escaped. The record must be dataless" << endl;
    return 1;
  }

  fwrite(OHout, 1, 4, this->gdsFile);

  return 0;
}